

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_free_all(isoent *isoent)

{
  isoent *in_RDI;
  bool bVar1;
  isoent *np_temp;
  isoent *np;
  isoent *isoent_00;
  
  if (in_RDI == (isoent *)0x0) {
    return;
  }
  do {
    for (; ((char)(in_RDI->field_0xe8 << 6) < '\0' && ((in_RDI->children).first != (isoent *)0x0));
        in_RDI = (in_RDI->children).first) {
    }
    while (in_RDI->chnext == (isoent *)0x0) {
      isoent_00 = in_RDI->parent;
      _isoent_free(isoent_00);
      bVar1 = isoent_00 == in_RDI;
      in_RDI = isoent_00;
      if (bVar1) {
        return;
      }
    }
    in_RDI = in_RDI->chnext;
    _isoent_free(in_RDI);
  } while( true );
}

Assistant:

static void
isoent_free_all(struct isoent *isoent)
{
	struct isoent *np, *np_temp;

	if (isoent == NULL)
		return;
	np = isoent;
	for (;;) {
		if (np->dir) {
			if (np->children.first != NULL) {
				/* Enter to sub directories. */
				np = np->children.first;
				continue;
			}
		}
		for (;;) {
			np_temp = np;
			if (np->chnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				_isoent_free(np_temp);
				if (np == np_temp)
					return;
			} else {
				np = np->chnext;
				_isoent_free(np_temp);
				break;
			}
		}
	}
}